

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::InternalCreate(RTPSession *this,RTPSessionParams *sessparams)

{
  RTPTransmitter *pRVar1;
  bool bVar2;
  int iVar3;
  ProbationType probtype;
  uint32_t uVar4;
  ReceiveMode RVar5;
  RTPMemoryManager *pRVar6;
  long lVar7;
  char *__src;
  undefined4 extraout_var;
  double dVar8;
  RTPTime local_498;
  undefined1 local_490 [8];
  RTCPSchedulerParams schedparams;
  undefined1 local_460 [8];
  string forcedcname;
  size_t buflen;
  uint8_t buf [1024];
  double timestampunit;
  int status;
  RTPSessionParams *sessparams_local;
  RTPSession *this_local;
  
  iVar3 = RTPPacketBuilder::Init(&this->packetbuilder,this->maxpacksize);
  if (iVar3 < 0) {
    if ((this->deletetransmitter & 1U) == 0) {
      return iVar3;
    }
    pRVar1 = this->rtptrans;
    pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
    return iVar3;
  }
  bVar2 = RTPSessionParams::GetUsePredefinedSSRC(sessparams);
  if (bVar2) {
    uVar4 = RTPSessionParams::GetPredefinedSSRC(sessparams);
    RTPPacketBuilder::AdjustSSRC(&this->packetbuilder,uVar4);
  }
  probtype = RTPSessionParams::GetProbationType(sessparams);
  RTPSources::SetProbationType(&(this->sources).super_RTPSources,probtype);
  uVar4 = RTPPacketBuilder::GetSSRC(&this->packetbuilder);
  iVar3 = RTPSources::CreateOwnSSRC(&(this->sources).super_RTPSources,uVar4);
  if (iVar3 < 0) {
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    if ((this->deletetransmitter & 1U) == 0) {
      return iVar3;
    }
    pRVar1 = this->rtptrans;
    pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
    return iVar3;
  }
  pRVar1 = this->rtptrans;
  RVar5 = RTPSessionParams::GetReceiveMode(sessparams);
  iVar3 = (*(pRVar1->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])(pRVar1,(ulong)RVar5);
  if (iVar3 < 0) {
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    if ((this->deletetransmitter & 1U) == 0) {
      return iVar3;
    }
    pRVar1 = this->rtptrans;
    pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
    return iVar3;
  }
  dVar8 = RTPSessionParams::GetOwnTimestampUnit(sessparams);
  forcedcname.field_2._8_8_ = 0x400;
  RTPSessionParams::GetCNAME_abi_cxx11_((string *)local_460,sessparams);
  lVar7 = std::__cxx11::string::length();
  if (lVar7 == 0) {
    bVar2 = RTPSessionParams::GetResolveLocalHostname(sessparams);
    this_local._4_4_ =
         CreateCNAME(this,(uint8_t *)&buflen,(size_t *)(forcedcname.field_2._M_local_buf + 8),bVar2)
    ;
    if (this_local._4_4_ < 0) {
      RTPPacketBuilder::Destroy(&this->packetbuilder);
      RTPSources::Clear(&(this->sources).super_RTPSources);
      if ((this->deletetransmitter & 1U) != 0) {
        pRVar1 = this->rtptrans;
        pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
      }
      schedparams.usehalfatstartup = true;
      schedparams.immediatebye = false;
      schedparams._26_2_ = 0;
      goto LAB_001680b1;
    }
  }
  else {
    __src = (char *)std::__cxx11::string::c_str();
    strncpy((char *)&buflen,__src,forcedcname.field_2._8_8_);
    forcedcname.field_2._M_local_buf[forcedcname.field_2._8_8_ + 0xf] = '\0';
    forcedcname.field_2._8_8_ = strlen((char *)&buflen);
  }
  this_local._4_4_ =
       RTCPPacketBuilder::Init
                 (&this->rtcpbuilder,this->maxpacksize,dVar8,&buflen,forcedcname.field_2._8_8_);
  if (this_local._4_4_ < 0) {
    RTPPacketBuilder::Destroy(&this->packetbuilder);
    RTPSources::Clear(&(this->sources).super_RTPSources);
    if ((this->deletetransmitter & 1U) != 0) {
      pRVar1 = this->rtptrans;
      pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
    }
    schedparams.usehalfatstartup = true;
    schedparams.immediatebye = false;
    schedparams._26_2_ = 0;
  }
  else {
    RTCPScheduler::Reset(&this->rtcpsched);
    iVar3 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])();
    RTCPScheduler::SetHeaderOverhead(&this->rtcpsched,CONCAT44(extraout_var,iVar3));
    RTCPSchedulerParams::RTCPSchedulerParams((RTCPSchedulerParams *)local_490);
    dVar8 = RTPSessionParams::GetSessionBandwidth(sessparams);
    this->sessionbandwidth = dVar8;
    dVar8 = RTPSessionParams::GetControlTrafficFraction(sessparams);
    this->controlfragment = dVar8;
    this_local._4_4_ =
         RTCPSchedulerParams::SetRTCPBandwidth
                   ((RTCPSchedulerParams *)local_490,this->sessionbandwidth * this->controlfragment)
    ;
    if (this_local._4_4_ < 0) {
      if ((this->deletetransmitter & 1U) != 0) {
        pRVar1 = this->rtptrans;
        pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
        RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
      }
      RTPPacketBuilder::Destroy(&this->packetbuilder);
      RTPSources::Clear(&(this->sources).super_RTPSources);
      RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
    }
    else {
      dVar8 = RTPSessionParams::GetSenderControlBandwidthFraction(sessparams);
      this_local._4_4_ =
           RTCPSchedulerParams::SetSenderBandwidthFraction((RTCPSchedulerParams *)local_490,dVar8);
      if (this_local._4_4_ < 0) {
        if ((this->deletetransmitter & 1U) != 0) {
          pRVar1 = this->rtptrans;
          pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
          RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
        }
        RTPPacketBuilder::Destroy(&this->packetbuilder);
        RTPSources::Clear(&(this->sources).super_RTPSources);
        RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
      }
      else {
        local_498 = RTPSessionParams::GetMinimumRTCPTransmissionInterval(sessparams);
        this_local._4_4_ =
             RTCPSchedulerParams::SetMinimumTransmissionInterval
                       ((RTCPSchedulerParams *)local_490,&local_498);
        if (this_local._4_4_ < 0) {
          if ((this->deletetransmitter & 1U) != 0) {
            pRVar1 = this->rtptrans;
            pRVar6 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
            RTPDelete<jrtplib::RTPTransmitter>(pRVar1,pRVar6);
          }
          RTPPacketBuilder::Destroy(&this->packetbuilder);
          RTPSources::Clear(&(this->sources).super_RTPSources);
          RTCPPacketBuilder::Destroy(&this->rtcpbuilder);
        }
        else {
          bVar2 = RTPSessionParams::GetUseHalfRTCPIntervalAtStartup(sessparams);
          RTCPSchedulerParams::SetUseHalfAtStartup((RTCPSchedulerParams *)local_490,bVar2);
          bVar2 = RTPSessionParams::GetRequestImmediateBYE(sessparams);
          RTCPSchedulerParams::SetRequestImmediateBYE((RTCPSchedulerParams *)local_490,bVar2);
          RTCPScheduler::SetParameters(&this->rtcpsched,(RTCPSchedulerParams *)local_490);
          bVar2 = RTPSessionParams::AcceptOwnPackets(sessparams);
          this->acceptownpackets = bVar2;
          dVar8 = RTPSessionParams::GetSourceTimeoutMultiplier(sessparams);
          this->membermultiplier = dVar8;
          dVar8 = RTPSessionParams::GetSenderTimeoutMultiplier(sessparams);
          this->sendermultiplier = dVar8;
          dVar8 = RTPSessionParams::GetBYETimeoutMultiplier(sessparams);
          this->byemultiplier = dVar8;
          dVar8 = RTPSessionParams::GetCollisionTimeoutMultiplier(sessparams);
          this->collisionmultiplier = dVar8;
          dVar8 = RTPSessionParams::GetNoteTimeoutMultiplier(sessparams);
          this->notemultiplier = dVar8;
          this->created = true;
          this_local._4_4_ = 0;
        }
      }
    }
    schedparams.usehalfatstartup = true;
    schedparams.immediatebye = false;
    schedparams._26_2_ = 0;
    RTCPSchedulerParams::~RTCPSchedulerParams((RTCPSchedulerParams *)local_490);
  }
LAB_001680b1:
  std::__cxx11::string::~string((string *)local_460);
  return this_local._4_4_;
}

Assistant:

int RTPSession::InternalCreate(const RTPSessionParams &sessparams)
{
	int status;

	// Initialize packet builder
	
	if ((status = packetbuilder.Init(maxpacksize)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	if (sessparams.GetUsePredefinedSSRC())
		packetbuilder.AdjustSSRC(sessparams.GetPredefinedSSRC());

#ifdef RTP_SUPPORT_PROBATION

	// Set probation type
	sources.SetProbationType(sessparams.GetProbationType());

#endif // RTP_SUPPORT_PROBATION

	// Add our own ssrc to the source table
	
	if ((status = sources.CreateOwnSSRC(packetbuilder.GetSSRC())) < 0)
	{
		packetbuilder.Destroy();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set the initial receive mode
	
	if ((status = rtptrans->SetReceiveMode(sessparams.GetReceiveMode())) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Init the RTCP packet builder
	
	double timestampunit = sessparams.GetOwnTimestampUnit();
	uint8_t buf[1024];
	size_t buflen = 1024;
	std::string forcedcname = sessparams.GetCNAME(); 

	if (forcedcname.length() == 0)
	{
		if ((status = CreateCNAME(buf,&buflen,sessparams.GetResolveLocalHostname())) < 0)
		{
			packetbuilder.Destroy();
			sources.Clear();
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			return status;
		}
	}
	else
	{
		RTP_STRNCPY((char *)buf, forcedcname.c_str(), buflen);
		buf[buflen-1] = 0;
		buflen = strlen((char *)buf);
	}
	
	if ((status = rtcpbuilder.Init(maxpacksize,timestampunit,buf,buflen)) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set scheduler parameters
	
	rtcpsched.Reset();
	rtcpsched.SetHeaderOverhead(rtptrans->GetHeaderOverhead());

	RTCPSchedulerParams schedparams;

	sessionbandwidth = sessparams.GetSessionBandwidth();
	controlfragment = sessparams.GetControlTrafficFraction();
	
	if ((status = schedparams.SetRTCPBandwidth(sessionbandwidth*controlfragment)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetSenderBandwidthFraction(sessparams.GetSenderControlBandwidthFraction())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetMinimumTransmissionInterval(sessparams.GetMinimumRTCPTransmissionInterval())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	schedparams.SetUseHalfAtStartup(sessparams.GetUseHalfRTCPIntervalAtStartup());
	schedparams.SetRequestImmediateBYE(sessparams.GetRequestImmediateBYE());
	
	rtcpsched.SetParameters(schedparams);

	// copy other parameters
	
	acceptownpackets = sessparams.AcceptOwnPackets();
	membermultiplier = sessparams.GetSourceTimeoutMultiplier();
	sendermultiplier = sessparams.GetSenderTimeoutMultiplier();
	byemultiplier = sessparams.GetBYETimeoutMultiplier();
	collisionmultiplier = sessparams.GetCollisionTimeoutMultiplier();
	notemultiplier = sessparams.GetNoteTimeoutMultiplier();

	// Do thread stuff if necessary
	
#ifdef RTP_SUPPORT_THREAD
	pollthread = 0;
	if (usingpollthread)
	{
		if (!sourcesmutex.IsInitialized())	
		{
			if (sourcesmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!buildermutex.IsInitialized())
		{
			if (buildermutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!schedmutex.IsInitialized())
		{
			if (schedmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!packsentmutex.IsInitialized())
		{
			if (packsentmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		
		pollthread = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPOLLTHREAD) RTPPollThread(*this,rtcpsched);
		if (pollthread == 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return ERR_RTP_OUTOFMEM;
		}
		if ((status = pollthread->Start(rtptrans)) < 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			RTPDelete(pollthread,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return status;
		}
	}
#endif // RTP_SUPPORT_THREAD	

	created = true;
	return 0;
}